

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O1

JSONNode __thiscall JSONNode::duplicate(JSONNode *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  internalJSONNode *piVar3;
  size_t *psVar4;
  internalJSONNode *piVar5;
  long *in_RSI;
  json_string local_48;
  
  lVar2 = *in_RSI;
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"no internal","");
  JSONDebug::_JSON_ASSERT(lVar2 != 0,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  piVar3 = (internalJSONNode *)*in_RSI;
  psVar4 = &piVar3->refcount;
  *psVar4 = *psVar4 + 1;
  this->internal = piVar3;
  psVar4 = getCopyCtorCounter();
  *psVar4 = *psVar4 + 1;
  piVar3 = (internalJSONNode *)*in_RSI;
  piVar5 = this->internal;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"copy ctor failed to ref count correctly","");
  JSONDebug::_JSON_ASSERT(piVar3 == piVar5,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  local_48.field_2._M_allocated_capacity._0_7_ = 0x65746e69206f6e;
  local_48.field_2._7_4_ = 0x6c616e72;
  local_48._M_string_length = 0xb;
  local_48.field_2._M_local_buf[0xb] = '\0';
  local_48._M_dataplus._M_p = (pointer)paVar1;
  JSONDebug::_JSON_ASSERT(this->internal != (internalJSONNode *)0x0,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  piVar5 = internalJSONNode::makeUnique(this->internal);
  this->internal = piVar5;
  piVar3 = (internalJSONNode *)*in_RSI;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"makeUniqueInternal failed","");
  JSONDebug::_JSON_ASSERT(piVar3 != piVar5,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return (JSONNode)(internalJSONNode *)this;
}

Assistant:

JSONNode JSONNode::duplicate(void) const json_nothrow {
    JSON_CHECK_INTERNAL();
    JSONNode mycopy(*this);
    #ifdef JSON_REF_COUNT
	   JSON_ASSERT(internal == mycopy.internal, JSON_TEXT("copy ctor failed to ref count correctly"));
	   mycopy.makeUniqueInternal();
    #endif
    JSON_ASSERT(internal != mycopy.internal, JSON_TEXT("makeUniqueInternal failed"));
    return mycopy;
}